

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall
crnd::crn_unpacker::unpack_level
          (crn_unpacker *this,void *pSrc,uint32 src_size_in_bytes,void **pDst,
          uint32 dst_size_in_bytes,uint32 row_pitch_in_bytes,uint32 level_index)

{
  byte bVar1;
  ushort uVar2;
  crn_header *pcVar3;
  bool bVar4;
  uint uVar5;
  uint32 output_pitch_in_bytes;
  int iVar6;
  uint uVar7;
  
  pcVar3 = this->m_pHeader;
  uVar2 = *(ushort *)(pcVar3->m_width).m_buf;
  uVar5 = (uint)((ushort)(uVar2 << 8 | uVar2 >> 8) >> ((byte)level_index & 0x1f));
  uVar2 = *(ushort *)(pcVar3->m_height).m_buf;
  uVar7 = (uint)((ushort)(uVar2 << 8 | uVar2 >> 8) >> ((byte)level_index & 0x1f));
  uVar5 = uVar5 + 3 + (uint)(uVar5 == 0) >> 2;
  bVar1 = (pcVar3->m_format).m_buf[0];
  if ((0xb < bVar1) || (iVar6 = 8, (0xe01U >> (bVar1 & 0x1f) & 1) == 0)) {
    iVar6 = (uint)(bVar1 != 0xd) * 8 + 8;
  }
  output_pitch_in_bytes = iVar6 * uVar5;
  if ((((row_pitch_in_bytes == 0) ||
       (((row_pitch_in_bytes & 3) == 0 &&
        (bVar4 = output_pitch_in_bytes <= row_pitch_in_bytes,
        output_pitch_in_bytes = row_pitch_in_bytes, bVar4)))) && (src_size_in_bytes != 0)) &&
     (uVar7 = uVar7 + 3 + (uint)(uVar7 == 0) >> 2,
     output_pitch_in_bytes * uVar7 <= dst_size_in_bytes)) {
    (this->m_codec).m_pDecode_buf = (uint8 *)pSrc;
    (this->m_codec).m_pDecode_buf_next = (uint8 *)pSrc;
    (this->m_codec).m_decode_buf_size = src_size_in_bytes;
    (this->m_codec).m_pDecode_buf_end = (uint8 *)((ulong)src_size_in_bytes + (long)pSrc);
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
    switch((pcVar3->m_format).m_buf[0]) {
    case '\0':
    case '\r':
      bVar4 = unpack_dxt1(this,(uint8 **)pDst,output_pitch_in_bytes,uVar5,uVar7);
      return bVar4;
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\x0e':
      bVar4 = unpack_dxt5(this,(uint8 **)pDst,output_pitch_in_bytes,uVar5,uVar7);
      return bVar4;
    case '\a':
    case '\b':
      bVar4 = unpack_dxn(this,(uint8 **)pDst,output_pitch_in_bytes,uVar5,uVar7);
      return bVar4;
    case '\t':
      bVar4 = unpack_dxt5a(this,(uint8 **)pDst,output_pitch_in_bytes,uVar5,uVar7);
      return bVar4;
    case '\n':
    case '\v':
      bVar4 = unpack_etc1(this,(uint8 **)pDst,output_pitch_in_bytes,uVar5,uVar7);
      return bVar4;
    case '\f':
      bVar4 = unpack_etc2a(this,(uint8 **)pDst,output_pitch_in_bytes,uVar5,uVar7);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool unpack_level(
            const void* pSrc, uint32 src_size_in_bytes,
            void** pDst, uint32 dst_size_in_bytes, uint32 row_pitch_in_bytes,
            uint32 level_index)
        {
#ifdef CRND_BUILD_DEBUG
            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
                if (!pDst[f])
                    return false;
#endif

            const uint32 width = math::maximum(m_pHeader->m_width >> level_index, 1U);
            const uint32 height = math::maximum(m_pHeader->m_height >> level_index, 1U);
            const uint32 blocks_x = (width + 3U) >> 2U;
            const uint32 blocks_y = (height + 3U) >> 2U;
            const uint32 block_size = m_pHeader->m_format == cCRNFmtDXT1 || m_pHeader->m_format == cCRNFmtDXT5A || m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC1S ? 8 : 16;

            uint32 minimal_row_pitch = block_size * blocks_x;
            if (!row_pitch_in_bytes)
                row_pitch_in_bytes = minimal_row_pitch;
            else if ((row_pitch_in_bytes < minimal_row_pitch) || (row_pitch_in_bytes & 3))
                return false;
            if (dst_size_in_bytes < row_pitch_in_bytes * blocks_y)
                return false;

            if (!m_codec.start_decoding(static_cast<const crnd::uint8*>(pSrc), src_size_in_bytes))
                return false;

            bool status = false;
            switch (m_pHeader->m_format)
            {
                case cCRNFmtDXT1:
                case cCRNFmtETC1S:
                    status = unpack_dxt1((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtDXT5:
                case cCRNFmtDXT5_CCxY:
                case cCRNFmtDXT5_xGBR:
                case cCRNFmtDXT5_AGBR:
                case cCRNFmtDXT5_xGxR:
                case cCRNFmtETC2AS:
                    status = unpack_dxt5((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtDXT5A:
                    status = unpack_dxt5a((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtDXN_XY:
                case cCRNFmtDXN_YX:
                    status = unpack_dxn((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtETC1:
                    status = unpack_etc1((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtETC2:
                    status = unpack_etc1((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                case cCRNFmtETC2A:
                    status = unpack_etc2a((uint8**)pDst, row_pitch_in_bytes, blocks_x, blocks_y);
                    break;
                default:
                    return false;
            }
            if (!status)
                return false;

            m_codec.stop_decoding();
            return true;
        }